

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O3

bool __thiscall
banksia::TourMng::pairingMatchListRecusive
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pairedSet)

{
  byte *pbVar1;
  pointer pcVar2;
  long lVar3;
  TourMng *this_00;
  bool bVar4;
  int iVar5;
  long *plVar6;
  const_iterator cVar7;
  size_type *psVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  pointer pTVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  string name0;
  string name1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  MatchRecord record;
  string local_198;
  string local_178;
  pointer local_158;
  TourMng *local_150;
  ulong local_148;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  ulong local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  _Base_ptr local_f8;
  undefined1 local_f0 [180];
  int local_3c;
  
  lVar10 = (long)(playerVec->
                 super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(playerVec->
                 super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar10 == 0) {
LAB_0015f5c5:
    bVar4 = true;
  }
  else {
    local_148 = (lVar10 >> 4) * -0x3333333333333333;
    local_f8 = &(pairedSet->_M_t)._M_impl.super__Rb_tree_header._M_header;
    uVar15 = local_148 + (local_148 == 0);
    bVar4 = true;
    uVar16 = 1;
    lVar10 = 0x98;
    uVar14 = 0;
    local_150 = this;
    local_140 = &pairedSet->_M_t;
    local_118 = uVar15;
    do {
      pTVar13 = (playerVec->
                super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(playerVec->
                      super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13 >> 4) *
               -0x3333333333333333;
      if (uVar11 < uVar14 || uVar11 - uVar14 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if ((pTVar13[uVar14].flag & 1) == 0) {
        pTVar13 = pTVar13 + uVar14;
        pcVar2 = (pTVar13->name)._M_dataplus._M_p;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_100 = uVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar2,pcVar2 + (pTVar13->name)._M_string_length);
        *(byte *)&pTVar13->flag = (byte)pTVar13->flag | 1;
        uVar14 = local_148;
        local_158 = pTVar13;
        local_110 = lVar10;
        local_108 = uVar16;
        do {
          if (uVar14 <= uVar16) {
            *(byte *)&local_158->flag = (byte)local_158->flag & 0xfe;
            uVar12 = 0;
            break;
          }
          pTVar13 = (playerVec->
                    super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar15 = ((long)(playerVec->
                          super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13 >> 4) *
                   -0x3333333333333333;
          if (uVar15 < uVar16 || uVar15 - uVar16 == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar16);
          }
          uVar12 = 7;
          if ((*(byte *)((long)pTVar13 + lVar10 + -8) & 1) == 0) {
            lVar3 = *(long *)((long)pTVar13 + lVar10 + -0x40);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,lVar3,*(long *)((long)pTVar13 + lVar10 + -0x38) + lVar3)
            ;
            local_138[0] = local_128;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_138,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            std::__cxx11::string::append((char *)local_138);
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_138,(ulong)local_178._M_dataplus._M_p);
            psVar8 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar8) {
              local_f0._16_8_ = *psVar8;
              local_f0._24_8_ = plVar6[3];
              local_f0._0_8_ = local_f0 + 0x10;
            }
            else {
              local_f0._16_8_ = *psVar8;
              local_f0._0_8_ = (size_type *)*plVar6;
            }
            local_f0._8_8_ = plVar6[1];
            *plVar6 = (long)psVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(local_140,(key_type *)local_f0);
            if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
              operator_delete((void *)local_f0._0_8_);
            }
            if (local_138[0] != local_128) {
              operator_delete(local_138[0]);
            }
            uVar12 = 7;
            if (cVar7._M_node == local_f8) {
              pbVar1 = (byte *)((long)pTVar13 + lVar10 + -8);
              *pbVar1 = *pbVar1 | 1;
              bVar4 = pairingMatchListRecusive
                                (local_150,playerVec,round,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_140);
              if (bVar4) {
                iVar5 = rand();
                this_00 = local_150;
                bVar9 = *(int *)((long)&(pTVar13->super_Obj)._vptr_Obj + lVar10) <
                        local_158->whiteCnt;
                if (local_150->type != swiss) {
                  bVar9 = (byte)iVar5;
                }
                MatchRecord::MatchRecord
                          ((MatchRecord *)local_f0,&local_198,&local_178,
                           (bool)(bVar9 & local_150->swapPairSides));
                local_3c = round;
                addMatchRecord(this_00,(MatchRecord *)local_f0);
                MatchRecord::~MatchRecord((MatchRecord *)local_f0);
                uVar12 = 1;
              }
              else {
                pbVar1 = (byte *)((long)pTVar13 + lVar10 + -8);
                *pbVar1 = *pbVar1 & 0xfe;
              }
            }
            uVar14 = local_148;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p);
              uVar14 = local_148;
            }
          }
          uVar16 = uVar16 + 1;
          lVar10 = lVar10 + 0x50;
        } while (uVar12 == 7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((uVar12 & 3) != 0) goto LAB_0015f5c5;
        bVar4 = false;
        uVar14 = local_100;
        uVar15 = local_118;
        lVar10 = local_110;
        uVar16 = local_108;
      }
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 + 1;
      lVar10 = lVar10 + 0x50;
    } while (uVar14 != uVar15);
  }
  return bVar4;
}

Assistant:

bool TourMng::pairingMatchListRecusive(std::vector<TourPlayer>& playerVec, int round, const std::set<std::string>& pairedSet)
{
    auto n = playerVec.size(); assert((n & 1) == 0); // must be even
    
    auto r = true;
    for(int i = 0; i < n; ++i) {
        auto& player0 = playerVec.at(i);
        if (player0.flag & 1) continue;
        r = false;
        auto name0 = player0.name;
        player0.flag |= 1;
        
        for(int j = i + 1; j < n; ++j) {
            auto& player1 = playerVec.at(j);
            if (player1.flag & 1) continue;
            auto name1 = player1.name;
            
            if (pairedSet.find(name0 + "*" + name1) != pairedSet.end()) {
                continue;
            }
            
            player1.flag |= 1;
            
            if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
                player1.flag &= ~1;
                continue;
            }
            
            // random swap to avoid name0 player plays all white side
            auto swap = rand() & 1;
            
            if (type == TourType::swiss) {
                swap = player0.whiteCnt > player1.whiteCnt;
            }
            MatchRecord record(name0, name1, swapPairSides && swap);
            record.round = round;
            addMatchRecord(record);
            return true;
        }
        player0.flag &= ~1;
        
    }
    return r;
}